

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int write_dns_header(char *buffer,int id,uint16_t flags,int qdcount,int ancount,int nscount,
                    int adcount)

{
  int iVar1;
  time_t tVar2;
  ushort uVar3;
  
  if (0xffff < (uint)id) {
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    id = rand();
  }
  *(short *)buffer = (short)id;
  *(uint16_t *)(buffer + 2) = flags << 8 | flags >> 8;
  uVar3 = (ushort)qdcount;
  if (0xffff < (uint)qdcount) {
    uVar3 = 0;
  }
  *(ushort *)(buffer + 4) = uVar3 << 8 | uVar3 >> 8;
  uVar3 = (ushort)ancount;
  if (0xffff < (uint)ancount) {
    uVar3 = 0;
  }
  *(ushort *)(buffer + 6) = uVar3 << 8 | uVar3 >> 8;
  uVar3 = (ushort)nscount;
  if (0xffff < (uint)nscount) {
    uVar3 = 0;
  }
  *(ushort *)(buffer + 8) = uVar3 << 8 | uVar3 >> 8;
  iVar1 = 0;
  if ((uint)adcount < 0x10000) {
    iVar1 = adcount;
  }
  *(ushort *)(buffer + 10) = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
  return 0xc;
}

Assistant:

int write_dns_header(char *buffer, int id, uint16_t flags, int qdcount,
                     int ancount, int nscount, int adcount) {
  struct dns_header *header;
  size_t size = sizeof(struct header_struct);
  header = (struct dns_header *)buffer;
  if IN_16b_RANGE (id) {
    header->id = id;
  } else {
    srand(time(NULL));
    header->id = rand();
  }
  header->flags = htons(flags);
  header->qdcount = htons(IN_16b_RANGE(qdcount) ? qdcount : 0);
  header->ancount = htons(IN_16b_RANGE(ancount) ? ancount : 0);
  header->nscount = htons(IN_16b_RANGE(nscount) ? nscount : 0);
  header->adcount = htons(IN_16b_RANGE(adcount) ? adcount : 0);
  return size;
}